

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# acbUtil.c
# Opt level: O0

void Acb_Ntk4DumpWeightsInt(Acb_Ntk_t *pNtk,Vec_Int_t *vObjs,char *pFileName)

{
  int *piVar1;
  int iVar2;
  int iVar3;
  int iVar4;
  Acb_ObjType_t AVar5;
  FILE *__stream;
  Vec_Int_t *p;
  Vec_Int_t *vRes;
  Vec_Int_t *p_00;
  char *pcVar6;
  int local_64;
  int Weight;
  char *pName;
  Vec_Int_t t;
  FILE *pFile;
  Vec_Int_t *vNexts;
  Vec_Int_t *vStart;
  Vec_Int_t *vDists;
  int iObj;
  int i;
  char *pFileName_local;
  Vec_Int_t *vObjs_local;
  Acb_Ntk_t *pNtk_local;
  
  __stream = fopen(pFileName,"wb");
  if (__stream == (FILE *)0x0) {
    printf("Canont open input file \"%s\".\n",pFileName);
  }
  else {
    p = Vec_IntAlloc(100);
    vRes = Vec_IntAlloc(100);
    iVar4 = Acb_NtkObjNumMax(pNtk);
    p_00 = Vec_IntStart(iVar4);
    Acb_NtkIncTravId(pNtk);
    for (vDists._4_4_ = 0; iVar4 = Vec_IntSize(vObjs), vDists._4_4_ < iVar4;
        vDists._4_4_ = vDists._4_4_ + 1) {
      iVar4 = Vec_IntEntry(vObjs,vDists._4_4_);
      Acb_ObjSetTravIdCur(pNtk,iVar4);
      Vec_IntWriteEntry(p_00,iVar4,1);
      Vec_IntPush(p,iVar4);
    }
    while( true ) {
      Acb_Ntk4CollectRing(pNtk,p,vRes,p_00);
      iVar4 = Vec_IntSize(vRes);
      if (iVar4 == 0) break;
      Vec_IntClear(p);
      iVar2 = p->nCap;
      iVar3 = p->nSize;
      piVar1 = p->pArray;
      iVar4 = vRes->nSize;
      p->nCap = vRes->nCap;
      p->nSize = iVar4;
      p->pArray = vRes->pArray;
      vRes->nCap = iVar2;
      vRes->nSize = iVar3;
      vRes->pArray = piVar1;
    }
    Vec_IntFree(p);
    Vec_IntFree(vRes);
    for (vDists._0_4_ = 1; iVar4 = Vec_StrSize(&pNtk->vObjType), (int)vDists < iVar4;
        vDists._0_4_ = (int)vDists + 1) {
      AVar5 = Acb_ObjType(pNtk,(int)vDists);
      if (AVar5 != ABC_OPER_NONE) {
        pcVar6 = Acb_ObjNameStr(pNtk,(int)vDists);
        local_64 = Vec_IntEntry(p_00,(int)vDists);
        if (local_64 == 0) {
          local_64 = 10000;
        }
        fprintf(__stream,"%s %d\n",pcVar6,(ulong)(local_64 + 100000));
      }
    }
    Vec_IntFree(p_00);
    fclose(__stream);
  }
  return;
}

Assistant:

void Acb_Ntk4DumpWeightsInt( Acb_Ntk_t * pNtk, Vec_Int_t * vObjs, char * pFileName )
{
    int i, iObj;//, Weight;
    Vec_Int_t * vDists, * vStart, * vNexts;
    FILE * pFile = fopen( pFileName, "wb" );
    if ( pFile == NULL )
    {
        printf( "Canont open input file \"%s\".\n", pFileName );
        return;
    }
    vStart = Vec_IntAlloc( 100 );
    vNexts = Vec_IntAlloc( 100 );
    vDists = Vec_IntStart( Acb_NtkObjNumMax(pNtk) );
    Acb_NtkIncTravId( pNtk );
    Vec_IntForEachEntry( vObjs, iObj, i )
    {
        Acb_ObjSetTravIdCur(pNtk, iObj);
        Vec_IntWriteEntry( vDists, iObj, 1 );
        Vec_IntPush( vStart, iObj );
    }    
    while ( 1 )
    {
        Acb_Ntk4CollectRing( pNtk, vStart, vNexts, vDists );
        if ( Vec_IntSize(vNexts) == 0 )
            break;
        Vec_IntClear( vStart );
        ABC_SWAP( Vec_Int_t, *vStart, *vNexts );
    }
    Vec_IntFree( vStart );
    Vec_IntFree( vNexts );
    // create weights
//    Vec_IntForEachEntry( vDists, Weight, i )
//        if ( Weight && Acb_ObjNameStr(pNtk, i)[0] != '1' )
//            fprintf( pFile, "%s %d\n", Acb_ObjNameStr(pNtk, i), 10000+Weight );
    Acb_NtkForEachObj( pNtk, iObj )
    {
        char * pName = Acb_ObjNameStr(pNtk, iObj);
        int Weight = Vec_IntEntry(vDists, iObj);
        if ( Weight == 0 )
            Weight = 10000;
        fprintf( pFile, "%s %d\n", pName, 100000+Weight );
    }

    Vec_IntFree( vDists );
    fclose( pFile );
}